

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::TextureWriterTestHelper<unsigned_char,_3U,_32849U>::resize
          (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this,createFlags flags,
          ktx_uint32_t layers,ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,
          ktx_uint32_t h,ktx_uint32_t d)

{
  ktx_uint32_t kVar1;
  
  WriterTestHelper<unsigned_char,_3U,_32849U>::resize
            (&this->super_WriterTestHelper<unsigned_char,_3U,_32849U>,flags,layers,faces,dimensions,
             w,h,d,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  (this->createInfo).super_ktxTextureCreateInfo.baseWidth = w;
  (this->createInfo).super_ktxTextureCreateInfo.baseHeight = h;
  (this->createInfo).super_ktxTextureCreateInfo.baseDepth = d;
  (this->createInfo).super_ktxTextureCreateInfo.numDimensions = dimensions;
  (this->createInfo).super_ktxTextureCreateInfo.generateMipmaps = (ktx_bool_t)((byte)flags >> 1 & 1)
  ;
  (this->createInfo).super_ktxTextureCreateInfo.isArray = (ktx_bool_t)((byte)flags >> 2 & 1);
  (this->createInfo).super_ktxTextureCreateInfo.numFaces = faces;
  (this->createInfo).super_ktxTextureCreateInfo.numLayers = layers;
  kVar1 = 1;
  if ((flags & 1) != 0) {
    if (h < w) {
      h = w;
    }
    kVar1 = 1;
    if (h <= d) {
      h = d;
    }
    for (; h != 1; h = h >> 1) {
      kVar1 = kVar1 + 1;
    }
  }
  (this->createInfo).super_ktxTextureCreateInfo.numLevels = kVar1;
  return;
}

Assistant:

void
    resize(createFlags flags, ktx_uint32_t layers, ktx_uint32_t faces,
           ktx_uint32_t dimensions,
           ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d)
    {
        WriterTestHelper<component_type, numComponents, internalformat>::resize(
                                               flags, layers, faces,
                                               dimensions,
                                               w, h, d);
        createInfo.resize(flags, layers, faces,
                          dimensions, w, h, d);
    }